

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O0

string * __thiscall
glcts::TessellationShaderErrorsTestCaseBase::getVertexShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderErrorsTestCaseBase *this,
          uint n_program_object)

{
  allocator<char> local_1d;
  uint local_1c;
  TessellationShaderErrorsTestCaseBase *pTStack_18;
  uint n_program_object_local;
  TessellationShaderErrorsTestCaseBase *this_local;
  
  local_1c = n_program_object;
  pTStack_18 = this;
  this_local = (TessellationShaderErrorsTestCaseBase *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"${VERSION}\n\nvoid main()\n{\n}\n",&local_1d);
  std::allocator<char>::~allocator(&local_1d);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderErrorsTestCaseBase::getVertexShaderCode(unsigned int n_program_object)
{
	DE_UNREF(n_program_object);

	return "${VERSION}\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "}\n";
}